

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O1

OpenMPClause *
OpenMPBindClause::addBindClause(OpenMPDirective *directive,OpenMPBindClauseBinding bind_binding)

{
  mapped_type *ppvVar1;
  ostream *poVar2;
  OpenMPClause *pOVar3;
  vector<OpenMPClause*,std::allocator<OpenMPClause*>> *this;
  OpenMPClause *new_clause;
  OpenMPClause *local_38;
  key_type local_2c;
  
  local_38 = (OpenMPClause *)CONCAT44(local_38._4_4_,0x1e);
  ppvVar1 = std::
            map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
            ::operator[](&directive->clauses,(key_type *)&local_38);
  local_38 = (OpenMPClause *)0x0;
  if (((*ppvVar1)->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      ((*ppvVar1)->super__Vector_base<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    pOVar3 = (OpenMPClause *)operator_new(0x70);
    (pOVar3->super_SourceLocation).line = 0;
    (pOVar3->super_SourceLocation).column = 0;
    (pOVar3->super_SourceLocation).parent_construct = (SourceLocation *)0x0;
    pOVar3->kind = OMPC_bind;
    pOVar3->clause_position = -1;
    (pOVar3->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pOVar3->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pOVar3->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pOVar3->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pOVar3->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pOVar3->expressionNodes).super__Vector_base<const_void_*,_std::allocator<const_void_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pOVar3->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pOVar3->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pOVar3->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pOVar3->_vptr_OpenMPClause = (_func_int **)&PTR_toString_abi_cxx11__001bb578;
    *(OpenMPBindClauseBinding *)&pOVar3[1]._vptr_OpenMPClause = bind_binding;
    local_38 = pOVar3;
    this = (vector<OpenMPClause*,std::allocator<OpenMPClause*>> *)operator_new(0x18);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    if (*(undefined8 **)(this + 8) == (undefined8 *)0x0) {
      std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>::
      _M_realloc_insert<OpenMPClause*const&>(this,(iterator)0x0,&local_38);
    }
    else {
      **(undefined8 **)(this + 8) = pOVar3;
      *(long *)(this + 8) = *(long *)(this + 8) + 8;
    }
    local_2c = OMPC_bind;
    ppvVar1 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[](&directive->clauses,&local_2c);
    *ppvVar1 = (mapped_type)this;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot have two bind clause for the directive ",0x2e);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,directive->kind);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ignored\n",10);
  }
  return local_38;
}

Assistant:

OpenMPClause* OpenMPBindClause::addBindClause(OpenMPDirective *directive, OpenMPBindClauseBinding bind_binding) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_bind);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPBindClause(bind_binding);
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_bind] = current_clauses;
    } else { /* could be an error since if clause may only appear once */
        std::cerr << "Cannot have two bind clause for the directive " << directive->getKind() << ", ignored\n";
    };

    return new_clause;
}